

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O0

int do_jz(void)

{
  undefined4 *puVar1;
  uint adr_1;
  uint adr;
  uint8_t high;
  
  if (registe_ptr->flag[0] == '\0') {
    if (code_ptr[registe_ptr->IP + 1] == '\x05') {
      registe_ptr->IP = *register_list[(byte)code_ptr[registe_ptr->IP + 2] / 0x10];
    }
    else {
      if (code_ptr[registe_ptr->IP + 1] != '\x06') {
        puVar1 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar1 = 0xf6;
        __cxa_throw(puVar1,&int::typeinfo,0);
      }
      registe_ptr->IP = *(int *)(code_ptr + (ulong)registe_ptr->IP + 2) + registe_ptr->CS;
    }
  }
  return 1;
}

Assistant:

int do_jz() {
	if (registe_ptr->flag[0] == 0){
		if (code_ptr[registe_ptr->IP + 1] == 5) {//寄存器跳转
			uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
			unsigned adr = *register_list[high];
			registe_ptr->IP = adr;
		}
		else if (code_ptr[registe_ptr->IP + 1] == 6) {//立即数跳转
			unsigned adr = *(unsigned*)(code_ptr + registe_ptr->IP + 2);
			registe_ptr->IP = adr + registe_ptr->CS;

		}
		else throw(LVM_EXECUTE_ERROR);
	}
	return LVM_SUCCESS;
}